

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O3

string * probeChannel_abi_cxx11_(string *__return_storage_ptr__,Device *device,int dir,size_t chan)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  ostream *poVar5;
  string *psVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  string sensors;
  string freqArgs;
  string corrections;
  string settings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  correctionsList;
  string antennas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  freqsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gainsList;
  string native;
  string dirName;
  RangeList bws;
  double fullScale;
  string streamArgs;
  string formats;
  Kwargs info;
  stringstream ss;
  string local_398;
  string local_378;
  undefined1 local_358 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  char local_328 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  string local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  undefined1 local_2a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  char local_278 [16];
  string *local_268;
  void *local_260;
  void *local_258;
  double local_248;
  string local_240;
  string local_220;
  ArgInfoList local_200 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_268 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar8 = "RX";
  if (dir == 0) {
    pcVar8 = "TX";
  }
  local_288._M_allocated_capacity = (size_type)local_278;
  pcVar9 = "RX";
  if (dir == 0) {
    pcVar9 = "TX";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,pcVar8,pcVar9 + 2);
  cVar4 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"----------------------------------------------------",0x34);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-- ",3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_288._M_allocated_capacity,local_288._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," Channel ",9);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"----------------------------------------------------",0x34);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  (**(code **)(*(long *)device + 0x40))(&local_1e8,device,dir,chan);
  if (local_1e8._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"  Channel Information:",0x16);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    for (; (_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
           &local_1e8._M_impl.super__Rb_tree_header;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::_Rb_tree_increment(local_1e8._M_impl.super__Rb_tree_header._M_header._M_left)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,
                          *(char **)(local_1e8._M_impl.super__Rb_tree_header._M_header._M_left + 1),
                          (long)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left[1].
                                _M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(local_1e8._M_impl.super__Rb_tree_header._M_header.
                                            _M_left + 2),
                          (long)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left[2].
                                _M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Full-duplex: ",0xf);
  bVar3 = (**(code **)(*(long *)device + 0x48))(device,dir,chan);
  pcVar8 = "NO";
  pcVar9 = "NO";
  if (bVar3 != 0) {
    pcVar9 = "YES";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,(ulong)bVar3 | 2);
  cVar4 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Supports AGC: ",0x10);
  bVar3 = (**(code **)(*(long *)device + 0x158))(device,dir,chan);
  if (bVar3 != 0) {
    pcVar8 = "YES";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,(ulong)bVar3 | 2);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  (**(code **)(*(long *)device + 0x50))(local_2a8,device,dir,chan);
  toString<std::__cxx11::string>
            (&local_220,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a8);
  if (local_220._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"  Stream formats: ",0x12);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  local_248 = 0.0;
  (**(code **)(*(long *)device + 0x58))(local_2a8,device,dir,chan);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Native format: ",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_2a8._0_8_,local_2a8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," [full-scale=",0xd);
  poVar5 = std::ostream::_M_insert<double>(local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  (**(code **)(*(long *)device + 0x60))(&local_2f8,device,dir,chan);
  toString_abi_cxx11_(&local_240,(ArgInfoList *)&local_2f8);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)&local_2f8);
  if (local_240._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Stream args:",0xe);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
    std::ostream::put(cVar4);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_240._M_dataplus._M_p,local_240._M_string_length);
  }
  (**(code **)(*(long *)device + 0xd8))(local_358,device,dir,chan);
  toString<std::__cxx11::string>
            (&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_358);
  if (local_2f8._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Antennas: ",0xc);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar4 = (**(code **)(*(long *)device + 0xf0))(device,dir,chan);
  if (cVar4 != '\0') {
    local_358._0_8_ = (pointer)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"DC removal","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  cVar4 = (**(code **)(*(long *)device + 0x108))(device,dir,chan);
  if (cVar4 != '\0') {
    local_358._0_8_ = (pointer)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"DC offset","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  cVar4 = (**(code **)(*(long *)device + 0x120))(device,dir,chan);
  if (cVar4 != '\0') {
    local_358._0_8_ = (pointer)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"IQ balance","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  toString<std::__cxx11::string>((string *)local_358,&local_318);
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Corrections: ",0xf);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_358._0_8_,local_358._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"  Full gain range: ",0x13);
  (**(code **)(*(long *)device + 400))(&local_398,device,dir,chan);
  toString_abi_cxx11_(&local_378,(Range *)&local_398);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_378._M_dataplus._M_p,local_378._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," dB",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  (**(code **)(*(long *)device + 0x150))(&local_2c0,device,dir,chan);
  if (local_2c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 8;
    uVar10 = 0;
    do {
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      lVar2 = *(long *)((long)local_2c0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_378,lVar2,
                 *(long *)((long)&((local_2c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar7) + lVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_378._M_dataplus._M_p,local_378._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," gain range: ",0xd);
      (**(code **)(*(long *)device + 0x198))(&local_338,device,dir,chan,&local_378);
      toString_abi_cxx11_(&local_398,(Range *)local_338._M_local_buf);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_398._M_dataplus._M_p,local_398._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," dB",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar10 < (ulong)((long)local_2c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2c0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"  Full freq range: ",0x13);
  (**(code **)(*(long *)device + 0x1c8))(&local_398,device,dir,chan);
  toString_abi_cxx11_(&local_378,(RangeList *)&local_398,1000000.0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_378._M_dataplus._M_p,local_378._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," MHz",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if (local_398._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  (**(code **)(*(long *)device + 0x1c0))(&local_2d8,device,dir,chan);
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 8;
    uVar10 = 0;
    do {
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      lVar2 = *(long *)((long)local_2d8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_378,lVar2,
                 *(long *)((long)&((local_2d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar7) + lVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_378._M_dataplus._M_p,local_378._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," freq range: ",0xd);
      (**(code **)(*(long *)device + 0x1d0))(&local_338,device,dir,chan,&local_378);
      toString_abi_cxx11_(&local_398,(RangeList *)local_338._M_local_buf,1000000.0);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_398._M_dataplus._M_p,local_398._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," MHz",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p);
      }
      if ((char *)local_338._M_allocated_capacity != (char *)0x0) {
        operator_delete((void *)local_338._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar10 < (ulong)((long)local_2d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  (**(code **)(*(long *)device + 0x1d8))(&local_398,device,dir,chan);
  toString_abi_cxx11_(&local_378,(ArgInfoList *)&local_398);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)&local_398);
  cVar4 = (char)(ostream *)local_1a8;
  if (local_378._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Tune args:",0xc);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
    std::ostream::put(cVar4);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_378._M_dataplus._M_p,local_378._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Sample rates: ",0x10);
  (**(code **)(*(long *)device + 0x1f8))(&local_338,device,dir,chan);
  toString_abi_cxx11_(&local_398,(RangeList *)local_338._M_local_buf,1000000.0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_398._M_dataplus._M_p,local_398._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," MSps",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  paVar1 = &local_398.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  if ((char *)local_338._M_allocated_capacity != (char *)0x0) {
    operator_delete((void *)local_338._M_allocated_capacity);
  }
  (**(code **)(*(long *)device + 0x218))(&local_260,device,dir,chan);
  if (local_260 != local_258) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"  Filter bandwidths: ",0x15);
    toString_abi_cxx11_(&local_398,(RangeList *)&local_260,1000000.0);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_398._M_dataplus._M_p,local_398._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," MHz",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar1) {
      operator_delete(local_398._M_dataplus._M_p);
    }
  }
  (**(code **)(*(long *)device + 0x2a0))(&local_338,device,dir,chan);
  toString<std::__cxx11::string>
            (&local_398,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_338);
  if (local_398._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Sensors: ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_398._M_dataplus._M_p,local_398._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  (**(code **)(*(long *)device + 0x308))(local_200,device,dir,chan);
  toString_abi_cxx11_((string *)&local_338,local_200);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector(local_200);
  if (local_338._8_8_ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"  Other Settings:",0x11);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
    std::ostream::put(cVar4);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(char *)local_338._M_allocated_capacity,local_338._8_8_);
  }
  std::__cxx11::stringbuf::str();
  if ((char *)local_338._M_allocated_capacity != local_328) {
    operator_delete((void *)local_338._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  if (local_260 != (void *)0x0) {
    operator_delete(local_260);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c0);
  if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
    operator_delete((void *)local_358._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1e8);
  if ((char *)local_288._M_allocated_capacity != local_278) {
    operator_delete((void *)local_288._M_allocated_capacity);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar6 = (string *)std::ios_base::~ios_base(local_138);
  return psVar6;
}

Assistant:

static std::string probeChannel(SoapySDR::Device *device, const int dir, const size_t chan)
{
    std::stringstream ss;

    std::string dirName = (dir==SOAPY_SDR_TX)?"TX":"RX";
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- " << dirName << " Channel " << chan << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    // info
    const auto info = device->getChannelInfo(dir, chan);
    if (info.size() > 0)
    {
        ss << "  Channel Information:" << std::endl;
        for (const auto &it : info)
        {
            ss << "    " << it.first << "=" << it.second << std::endl;
        }
    }

    ss << "  Full-duplex: " << (device->getFullDuplex(dir, chan)?"YES":"NO") << std::endl;
    ss << "  Supports AGC: " << (device->hasGainMode(dir, chan)?"YES":"NO") << std::endl;

    //formats
    std::string formats = toString(device->getStreamFormats(dir, chan));
    if (not formats.empty()) ss << "  Stream formats: " << formats << std::endl;

    //native
    double fullScale = 0.0;
    std::string native = device->getNativeStreamFormat(dir, chan, fullScale);
    ss << "  Native format: " << native << " [full-scale=" << fullScale << "]" << std::endl;    

    //stream args
    std::string streamArgs = toString(device->getStreamArgsInfo(dir, chan));
    if (not streamArgs.empty()) ss << "  Stream args:" << std::endl << streamArgs;

    //antennas
    std::string antennas = toString(device->listAntennas(dir, chan));
    if (not antennas.empty()) ss << "  Antennas: " << antennas << std::endl;

    //corrections
    std::vector<std::string> correctionsList;
    if (device->hasDCOffsetMode(dir, chan)) correctionsList.push_back("DC removal");
    if (device->hasDCOffset(dir, chan)) correctionsList.push_back("DC offset");
    if (device->hasIQBalance(dir, chan)) correctionsList.push_back("IQ balance");
    std::string corrections = toString(correctionsList);
    if (not corrections.empty()) ss << "  Corrections: " << corrections << std::endl;

    //gains
    ss << "  Full gain range: " << toString(device->getGainRange(dir, chan)) << " dB" << std::endl;
    std::vector<std::string> gainsList = device->listGains(dir, chan);
    for (size_t i = 0; i < gainsList.size(); i++)
    {
        const std::string name = gainsList[i];
        ss << "    " << name << " gain range: " << toString(device->getGainRange(dir, chan, name)) << " dB" << std::endl;
    }

    //frequencies
    ss << "  Full freq range: " << toString(device->getFrequencyRange(dir, chan), 1e6) << " MHz" << std::endl;
    std::vector<std::string> freqsList = device->listFrequencies(dir, chan);
    for (size_t i = 0; i < freqsList.size(); i++)
    {
        const std::string name = freqsList[i];
        ss << "    " << name << " freq range: " << toString(device->getFrequencyRange(dir, chan, name), 1e6) << " MHz" << std::endl;
    }

    //freq args
    std::string freqArgs = toString(device->getFrequencyArgsInfo(dir, chan));
    if (not freqArgs.empty()) ss << "  Tune args:" << std::endl << freqArgs;

    //rates
    ss << "  Sample rates: " << toString(device->getSampleRateRange(dir, chan), 1e6) << " MSps" << std::endl;

    //bandwidths
    const auto bws = device->getBandwidthRange(dir, chan);
    if (not bws.empty()) ss << "  Filter bandwidths: " << toString(bws, 1e6) << " MHz" << std::endl;

    //sensors
    std::string sensors = toString(device->listSensors(dir, chan));
    if (not sensors.empty()) ss << "  Sensors: " << sensors << std::endl;

    //settings
    std::string settings = toString(device->getSettingInfo(dir, chan));
    if (not settings.empty()) ss << "  Other Settings:" << std::endl << settings;

    return ss.str();
}